

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

int Gia_ManFromIfAig_rec(Gia_Man_t *pNew,If_Man_t *pIfMan,If_Obj_t *pIfObj)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = (pIfObj->field_22).iCopy;
  if (iVar3 == 0) {
    uVar1 = Gia_ManFromIfAig_rec(pNew,pIfMan,pIfObj->pFanin0);
    uVar2 = Gia_ManFromIfAig_rec(pNew,pIfMan,pIfObj->pFanin1);
    if (((int)uVar1 < 0) || ((int)uVar2 < 0)) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x132,"int Abc_LitNotCond(int, int)");
    }
    iVar3 = Gia_ManHashAnd(pNew,*(uint *)pIfObj >> 4 & 1 ^ uVar1,*(uint *)pIfObj >> 5 & 1 ^ uVar2);
    (pIfObj->field_22).iCopy = iVar3;
  }
  return iVar3;
}

Assistant:

int Gia_ManFromIfAig_rec( Gia_Man_t * pNew, If_Man_t * pIfMan, If_Obj_t * pIfObj )
{
    int iLit0, iLit1;
    if ( pIfObj->iCopy )
        return pIfObj->iCopy;
    iLit0 = Gia_ManFromIfAig_rec( pNew, pIfMan, pIfObj->pFanin0 );
    iLit1 = Gia_ManFromIfAig_rec( pNew, pIfMan, pIfObj->pFanin1 );
    iLit0 = Abc_LitNotCond( iLit0, pIfObj->fCompl0 );
    iLit1 = Abc_LitNotCond( iLit1, pIfObj->fCompl1 );
    pIfObj->iCopy = Gia_ManHashAnd( pNew, iLit0, iLit1 );
    return pIfObj->iCopy;
}